

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int nonce_function_ecdsa_adaptor
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *pk33,uchar *algo,size_t algolen,
              void *data)

{
  int iVar1;
  long lVar2;
  secp256k1_sha256 sha;
  uchar masked_key [32];
  secp256k1_sha256 local_98;
  
  if (algo == (uchar *)0x0) {
    return 0;
  }
  if (data != (void *)0x0) {
    local_98.s[0] = 0xd14c7bd9;
    local_98.s[1] = 0x95d35e6;
    local_98.s[2] = 0xb8490a88;
    local_98.s[3] = 0xfb00ef74;
    local_98.s[4] = 0xbaa488f;
    local_98.s[5] = 0x69366693;
    local_98.s[6] = 0x1c81c5ba;
    local_98.s[7] = 0xc33b296a;
    local_98.bytes = 0x40;
    secp256k1_sha256_write(&local_98,(uchar *)data,0x20);
    secp256k1_sha256_finalize(&local_98,masked_key);
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      masked_key[lVar2] = masked_key[lVar2] ^ key32[lVar2];
    }
  }
  if (algolen == 4) {
    iVar1 = secp256k1_memcmp_var(algo,"DLEQ",4);
    if (iVar1 == 0) {
      secp256k1_nonce_function_dleq_sha256_tagged(&local_98);
      goto LAB_00117511;
    }
  }
  else if ((algolen == 0x10) &&
          (iVar1 = secp256k1_memcmp_var(algo,"ECDSAadaptor/non",0x10), iVar1 == 0)) {
    local_98.s[0] = 0x791dae43;
    local_98.s[1] = 0xe52d3b44;
    local_98.s[2] = 0x37f9edea;
    local_98.s[3] = 0x9bfd2ab1;
    local_98.s[4] = 0xcfb0f44d;
    local_98.s[5] = 0xccf1d880;
    local_98.s[6] = 0xd18f2c13;
    local_98.s[7] = 0xa37b9024;
    local_98.bytes = 0x40;
    goto LAB_00117511;
  }
  secp256k1_sha256_initialize_tagged(&local_98,algo,algolen);
LAB_00117511:
  if (data != (void *)0x0) {
    key32 = masked_key;
  }
  secp256k1_sha256_write(&local_98,key32,0x20);
  secp256k1_sha256_write(&local_98,pk33,0x21);
  secp256k1_sha256_write(&local_98,msg32,0x20);
  secp256k1_sha256_finalize(&local_98,nonce32);
  return 1;
}

Assistant:

static int nonce_function_ecdsa_adaptor(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *pk33, const unsigned char *algo, size_t algolen, void *data) {
    secp256k1_sha256 sha;
    unsigned char masked_key[32];
    int i;

    if (algo == NULL) {
        return 0;
    }

    if (data != NULL) {
        secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, data, 32);
        secp256k1_sha256_finalize(&sha, masked_key);
        for (i = 0; i < 32; i++) {
            masked_key[i] ^= key32[i];
        }
    }

    /* Tag the hash with algo which is important to avoid nonce reuse across
     * algorithims. An optimized tagging implementation is used if the default
     * tag is provided. */
    if (algolen == sizeof(ecdsa_adaptor_algo)
            && secp256k1_memcmp_var(algo, ecdsa_adaptor_algo, algolen) == 0) {
        secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged(&sha);
    } else if (algolen == sizeof(dleq_algo)
            && secp256k1_memcmp_var(algo, dleq_algo, algolen) == 0) {
        secp256k1_nonce_function_dleq_sha256_tagged(&sha);
    } else {
        secp256k1_sha256_initialize_tagged(&sha, algo, algolen);
    }

    /* Hash (masked-)key||pk||msg using the tagged hash as per BIP-340 */
    if (data != NULL) {
        secp256k1_sha256_write(&sha, masked_key, 32);
    } else {
        secp256k1_sha256_write(&sha, key32, 32);
    }
    secp256k1_sha256_write(&sha, pk33, 33);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}